

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict stmt(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  bool bVar2;
  int iVar3;
  node_t_conflict op1_00;
  node_t_conflict pnVar4;
  DLIST_node_t *list;
  char *pcVar5;
  node_t_conflict op3_00;
  node_code_t nc;
  pos_t p;
  undefined1 auStack_68 [4];
  int indirect_p;
  pos_t pos;
  node_t_conflict r;
  node_t_conflict op3;
  node_t_conflict op2;
  node_t_conflict op1;
  node_t_conflict n;
  node_t_conflict l;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  op1_00 = new_node(c2m_ctx,N_LIST);
  while (pnVar4 = try_f(c2m_ctx,label), pnVar4 != &err_struct) {
    op_append(c2m_ctx,op1_00,pnVar4);
  }
  if ((short)*(undefined4 *)ppVar1->curr_token == 0x7b) {
    pos._8_8_ = compound_stmt(c2m_ctx,no_err_p);
    if ((node *)pos._8_8_ == &err_struct) {
      return (node_t_conflict)pos._8_8_;
    }
    pnVar4 = DLIST_node_t_head(&(op1_00->u).ops);
    if (pnVar4 != (node_t_conflict)0x0) {
      pnVar4 = DLIST_node_t_head((DLIST_node_t *)(pos._8_8_ + 0x20));
      if (pnVar4->code == N_LIST) {
        pnVar4 = DLIST_node_t_head((DLIST_node_t *)(pos._8_8_ + 0x20));
        pnVar4 = DLIST_node_t_head(&(pnVar4->u).ops);
        if (pnVar4 == (node_t_conflict)0x0) {
          list = (DLIST_node_t *)(pos._8_8_ + 0x20);
          pnVar4 = DLIST_node_t_head((DLIST_node_t *)(pos._8_8_ + 0x20));
          DLIST_node_t_remove(list,pnVar4);
          DLIST_node_t_prepend((DLIST_node_t *)(pos._8_8_ + 0x20),op1_00);
          return (node_t_conflict)pos._8_8_;
        }
      }
      __assert_fail("NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x143a,"node_t stmt(c2m_ctx_t, int)");
    }
  }
  else {
    iVar3 = match(c2m_ctx,0x129,(pos_t *)auStack_68,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar3 == 0) {
      iVar3 = match(c2m_ctx,0x135,(pos_t *)auStack_68,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar3 == 0) {
        iVar3 = match(c2m_ctx,0x13c,(pos_t *)auStack_68,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar3 == 0) {
          iVar3 = match(c2m_ctx,0x121,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar3 == 0) {
            iVar3 = match(c2m_ctx,0x127,(pos_t *)auStack_68,(node_code_t *)0x0,
                          (node_t_conflict *)0x0);
            if (iVar3 == 0) {
              iVar3 = match(c2m_ctx,0x128,(pos_t *)auStack_68,(node_code_t *)0x0,
                            (node_t_conflict *)0x0);
              if (iVar3 == 0) {
                iVar3 = match(c2m_ctx,0x11f,(pos_t *)auStack_68,(node_code_t *)0x0,
                              (node_t_conflict *)0x0);
                if (iVar3 == 0) {
                  iVar3 = match(c2m_ctx,0x11b,(pos_t *)auStack_68,(node_code_t *)0x0,
                                (node_t_conflict *)0x0);
                  if (iVar3 == 0) {
                    iVar3 = match(c2m_ctx,0x12f,(pos_t *)auStack_68,(node_code_t *)0x0,
                                  (node_t_conflict *)0x0);
                    if (iVar3 == 0) {
                      if ((short)*(undefined4 *)ppVar1->curr_token == 0x3b) {
                        pos._8_8_ = new_node(c2m_ctx,N_IGNORE);
                      }
                      else {
                        pos._8_8_ = expr(c2m_ctx,no_err_p);
                        if ((node *)pos._8_8_ == &err_struct) {
                          return &err_struct;
                        }
                      }
                      iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,
                                    (node_t_conflict *)0x0);
                      if (iVar3 == 0) {
                        if (ppVar1->record_level == 0) {
                          pcVar5 = get_token_name(c2m_ctx,0x3b);
                          syntax_error(c2m_ctx,pcVar5);
                        }
                        c2m_ctx_local = (c2m_ctx_t)&err_struct;
                        return (node_t_conflict)c2m_ctx_local;
                      }
                      p = get_node_pos(c2m_ctx,(node_t_conflict)pos._8_8_);
                      pos._8_8_ = new_pos_node2(c2m_ctx,N_EXPR,p,op1_00,(node_t_conflict)pos._8_8_);
                    }
                    else {
                      iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,
                                    (node_t_conflict *)0x0);
                      if (iVar3 == 0) {
                        pos._8_8_ = expr(c2m_ctx,no_err_p);
                        if ((node *)pos._8_8_ == &err_struct) {
                          return &err_struct;
                        }
                        iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,
                                      (node_t_conflict *)0x0);
                        if (iVar3 == 0) {
                          if (ppVar1->record_level == 0) {
                            pcVar5 = get_token_name(c2m_ctx,0x3b);
                            syntax_error(c2m_ctx,pcVar5);
                          }
                          c2m_ctx_local = (c2m_ctx_t)&err_struct;
                          return (node_t_conflict)c2m_ctx_local;
                        }
                      }
                      else {
                        pos._8_8_ = new_node(c2m_ctx,N_IGNORE);
                      }
                      pos._8_8_ = new_pos_node2(c2m_ctx,N_RETURN,_auStack_68,op1_00,
                                                (node_t_conflict)pos._8_8_);
                    }
                  }
                  else {
                    iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,
                                  (node_t_conflict *)0x0);
                    if (iVar3 == 0) {
                      if (ppVar1->record_level == 0) {
                        pcVar5 = get_token_name(c2m_ctx,0x3b);
                        syntax_error(c2m_ctx,pcVar5);
                      }
                      c2m_ctx_local = (c2m_ctx_t)&err_struct;
                      return (node_t_conflict)c2m_ctx_local;
                    }
                    pos._8_8_ = new_pos_node1(c2m_ctx,N_BREAK,_auStack_68,op1_00);
                  }
                }
                else {
                  iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0)
                  ;
                  if (iVar3 == 0) {
                    if (ppVar1->record_level == 0) {
                      pcVar5 = get_token_name(c2m_ctx,0x3b);
                      syntax_error(c2m_ctx,pcVar5);
                    }
                    c2m_ctx_local = (c2m_ctx_t)&err_struct;
                    return (node_t_conflict)c2m_ctx_local;
                  }
                  pos._8_8_ = new_pos_node1(c2m_ctx,N_CONTINUE,_auStack_68,op1_00);
                }
              }
              else {
                bVar2 = false;
                iVar3 = match(c2m_ctx,0x2a,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar3 == 0) {
                  iVar3 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,
                                (node_t_conflict *)&pos.lno);
                  if (iVar3 == 0) {
                    if (ppVar1->record_level == 0) {
                      pcVar5 = get_token_name(c2m_ctx,0x103);
                      syntax_error(c2m_ctx,pcVar5);
                    }
                    c2m_ctx_local = (c2m_ctx_t)&err_struct;
                    return (node_t_conflict)c2m_ctx_local;
                  }
                }
                else {
                  bVar2 = true;
                  pos._8_8_ = expr(c2m_ctx,no_err_p);
                  if ((node *)pos._8_8_ == &err_struct) {
                    return &err_struct;
                  }
                }
                iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar3 == 0) {
                  if (ppVar1->record_level == 0) {
                    pcVar5 = get_token_name(c2m_ctx,0x3b);
                    syntax_error(c2m_ctx,pcVar5);
                  }
                  c2m_ctx_local = (c2m_ctx_t)&err_struct;
                  return (node_t_conflict)c2m_ctx_local;
                }
                nc = N_GOTO;
                if (bVar2) {
                  nc = N_INDIRECT_GOTO;
                }
                pos._8_8_ = new_pos_node2(c2m_ctx,nc,_auStack_68,op1_00,(node_t_conflict)pos._8_8_);
              }
            }
            else {
              iVar3 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar3 == 0) {
                if (ppVar1->record_level == 0) {
                  pcVar5 = get_token_name(c2m_ctx,0x28);
                  syntax_error(c2m_ctx,pcVar5);
                }
                c2m_ctx_local = (c2m_ctx_t)&err_struct;
                return (node_t_conflict)c2m_ctx_local;
              }
              pnVar4 = new_pos_node(c2m_ctx,N_FOR,_auStack_68);
              pnVar4->attr = ppVar1->curr_scope;
              ppVar1->curr_scope = pnVar4;
              pos._8_8_ = try_f(c2m_ctx,declaration);
              if ((node *)pos._8_8_ == &err_struct) {
                ppVar1->curr_scope = (node_t_conflict)pnVar4->attr;
                iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar3 == 0) {
                  op2 = expr(c2m_ctx,no_err_p);
                  if (op2 == &err_struct) {
                    return &err_struct;
                  }
                  pos._8_8_ = op2;
                  iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0)
                  ;
                  if (iVar3 == 0) {
                    if (ppVar1->record_level == 0) {
                      pcVar5 = get_token_name(c2m_ctx,0x3b);
                      syntax_error(c2m_ctx,pcVar5);
                    }
                    c2m_ctx_local = (c2m_ctx_t)&err_struct;
                    return (node_t_conflict)c2m_ctx_local;
                  }
                }
                else {
                  op2 = new_node(c2m_ctx,N_IGNORE);
                }
              }
              else {
                ppVar1->curr_scope = (node_t_conflict)pnVar4->attr;
                op2 = (node_t_conflict)pos._8_8_;
              }
              iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar3 == 0) {
                op3 = expr(c2m_ctx,no_err_p);
                if (op3 == &err_struct) {
                  return &err_struct;
                }
                pos._8_8_ = op3;
                iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar3 == 0) {
                  if (ppVar1->record_level == 0) {
                    pcVar5 = get_token_name(c2m_ctx,0x3b);
                    syntax_error(c2m_ctx,pcVar5);
                  }
                  c2m_ctx_local = (c2m_ctx_t)&err_struct;
                  return (node_t_conflict)c2m_ctx_local;
                }
              }
              else {
                op3 = new_node(c2m_ctx,N_IGNORE);
              }
              if ((short)*(undefined4 *)ppVar1->curr_token == 0x29) {
                r = new_node(c2m_ctx,N_IGNORE);
              }
              else {
                pos._8_8_ = expr(c2m_ctx,no_err_p);
                r = (node_t_conflict)pos._8_8_;
                if ((node *)pos._8_8_ == &err_struct) {
                  return &err_struct;
                }
              }
              iVar3 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar3 == 0) {
                if (ppVar1->record_level == 0) {
                  pcVar5 = get_token_name(c2m_ctx,0x29);
                  syntax_error(c2m_ctx,pcVar5);
                }
                c2m_ctx_local = (c2m_ctx_t)&err_struct;
                return (node_t_conflict)c2m_ctx_local;
              }
              pos._8_8_ = stmt(c2m_ctx,no_err_p);
              if ((node *)pos._8_8_ == &err_struct) {
                return &err_struct;
              }
              op_append(c2m_ctx,pnVar4,op1_00);
              op_append(c2m_ctx,pnVar4,op2);
              op_append(c2m_ctx,pnVar4,op3);
              op_append(c2m_ctx,pnVar4,r);
              op_append(c2m_ctx,pnVar4,(node_t_conflict)pos._8_8_);
              pos._8_8_ = pnVar4;
            }
          }
          else {
            pnVar4 = stmt(c2m_ctx,no_err_p);
            if (pnVar4 == &err_struct) {
              return &err_struct;
            }
            pos._8_8_ = pnVar4;
            iVar3 = match(c2m_ctx,0x13c,(pos_t *)auStack_68,(node_code_t *)0x0,
                          (node_t_conflict *)0x0);
            if (iVar3 == 0) {
              if (ppVar1->record_level == 0) {
                pcVar5 = get_token_name(c2m_ctx,0x13c);
                syntax_error(c2m_ctx,pcVar5);
              }
              c2m_ctx_local = (c2m_ctx_t)&err_struct;
              return (node_t_conflict)c2m_ctx_local;
            }
            iVar3 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar3 == 0) {
              if (ppVar1->record_level == 0) {
                pcVar5 = get_token_name(c2m_ctx,0x28);
                syntax_error(c2m_ctx,pcVar5);
              }
              c2m_ctx_local = (c2m_ctx_t)&err_struct;
              return (node_t_conflict)c2m_ctx_local;
            }
            pos._8_8_ = expr(c2m_ctx,no_err_p);
            if ((node *)pos._8_8_ == &err_struct) {
              return &err_struct;
            }
            iVar3 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar3 == 0) {
              if (ppVar1->record_level == 0) {
                pcVar5 = get_token_name(c2m_ctx,0x29);
                syntax_error(c2m_ctx,pcVar5);
              }
              c2m_ctx_local = (c2m_ctx_t)&err_struct;
              return (node_t_conflict)c2m_ctx_local;
            }
            iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar3 == 0) {
              if (ppVar1->record_level == 0) {
                pcVar5 = get_token_name(c2m_ctx,0x3b);
                syntax_error(c2m_ctx,pcVar5);
              }
              c2m_ctx_local = (c2m_ctx_t)&err_struct;
              return (node_t_conflict)c2m_ctx_local;
            }
            pos._8_8_ = new_pos_node3(c2m_ctx,N_DO,_auStack_68,op1_00,(node_t_conflict)pos._8_8_,
                                      pnVar4);
          }
        }
        else {
          iVar3 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar3 == 0) {
            if (ppVar1->record_level == 0) {
              pcVar5 = get_token_name(c2m_ctx,0x28);
              syntax_error(c2m_ctx,pcVar5);
            }
            c2m_ctx_local = (c2m_ctx_t)&err_struct;
            return (node_t_conflict)c2m_ctx_local;
          }
          pnVar4 = expr(c2m_ctx,no_err_p);
          if (pnVar4 == &err_struct) {
            return &err_struct;
          }
          pos._8_8_ = pnVar4;
          iVar3 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar3 == 0) {
            if (ppVar1->record_level == 0) {
              pcVar5 = get_token_name(c2m_ctx,0x29);
              syntax_error(c2m_ctx,pcVar5);
            }
            c2m_ctx_local = (c2m_ctx_t)&err_struct;
            return (node_t_conflict)c2m_ctx_local;
          }
          pos._8_8_ = stmt(c2m_ctx,no_err_p);
          if ((node *)pos._8_8_ == &err_struct) {
            return &err_struct;
          }
          pos._8_8_ = new_pos_node3(c2m_ctx,N_WHILE,_auStack_68,op1_00,pnVar4,
                                    (node_t_conflict)pos._8_8_);
        }
      }
      else {
        iVar3 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar3 == 0) {
          if (ppVar1->record_level == 0) {
            pcVar5 = get_token_name(c2m_ctx,0x28);
            syntax_error(c2m_ctx,pcVar5);
          }
          c2m_ctx_local = (c2m_ctx_t)&err_struct;
          return (node_t_conflict)c2m_ctx_local;
        }
        pnVar4 = expr(c2m_ctx,no_err_p);
        if (pnVar4 == &err_struct) {
          return &err_struct;
        }
        pos._8_8_ = pnVar4;
        iVar3 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar3 == 0) {
          if (ppVar1->record_level == 0) {
            pcVar5 = get_token_name(c2m_ctx,0x29);
            syntax_error(c2m_ctx,pcVar5);
          }
          c2m_ctx_local = (c2m_ctx_t)&err_struct;
          return (node_t_conflict)c2m_ctx_local;
        }
        pos._8_8_ = stmt(c2m_ctx,no_err_p);
        if ((node *)pos._8_8_ == &err_struct) {
          return &err_struct;
        }
        pos._8_8_ = new_pos_node3(c2m_ctx,N_SWITCH,_auStack_68,op1_00,pnVar4,
                                  (node_t_conflict)pos._8_8_);
      }
    }
    else {
      iVar3 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar3 == 0) {
        if (ppVar1->record_level == 0) {
          pcVar5 = get_token_name(c2m_ctx,0x28);
          syntax_error(c2m_ctx,pcVar5);
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
        return (node_t_conflict)c2m_ctx_local;
      }
      pnVar4 = expr(c2m_ctx,no_err_p);
      if (pnVar4 == &err_struct) {
        return &err_struct;
      }
      pos._8_8_ = pnVar4;
      iVar3 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar3 == 0) {
        if (ppVar1->record_level == 0) {
          pcVar5 = get_token_name(c2m_ctx,0x29);
          syntax_error(c2m_ctx,pcVar5);
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
        return (node_t_conflict)c2m_ctx_local;
      }
      op3_00 = stmt(c2m_ctx,no_err_p);
      if (op3_00 == &err_struct) {
        return &err_struct;
      }
      pos._8_8_ = op3_00;
      iVar3 = match(c2m_ctx,0x123,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar3 == 0) {
        pos._8_8_ = new_node(c2m_ctx,N_IGNORE);
      }
      else {
        pos._8_8_ = stmt(c2m_ctx,no_err_p);
        if ((node *)pos._8_8_ == &err_struct) {
          return &err_struct;
        }
      }
      pos._8_8_ = new_pos_node4(c2m_ctx,N_IF,_auStack_68,op1_00,pnVar4,op3_00,
                                (node_t_conflict)pos._8_8_);
    }
  }
  return (node_t_conflict)pos._8_8_;
}

Assistant:

D (stmt) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t l, n, op1, op2, op3, r;
  pos_t pos;

  l = new_node (c2m_ctx, N_LIST);
  while ((op1 = TRY (label)) != err_node) {
    op_append (c2m_ctx, l, op1);
  }
  if (C ('{')) {
    P (compound_stmt);
    if (NL_HEAD (l->u.ops) != NULL) { /* replace empty label list */
      assert (NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL);
      NL_REMOVE (r->u.ops, NL_HEAD (r->u.ops));
      NL_PREPEND (r->u.ops, l);
    }
  } else if (MP (T_IF, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    op2 = r;
    if (!M (T_ELSE)) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (stmt);
    }
    r = new_pos_node4 (c2m_ctx, N_IF, pos, l, op1, op2, r);
  } else if (MP (T_SWITCH, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_SWITCH, pos, l, op1, r);
  } else if (MP (T_WHILE, pos)) { /* iteration-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_WHILE, pos, l, op1, r);
  } else if (M (T_DO)) { /* iteration-statement */
    P (stmt);
    op1 = r;
    PTP (T_WHILE, pos);
    PT ('(');
    P (expr);
    PT (')');
    PT (';');
    r = new_pos_node3 (c2m_ctx, N_DO, pos, l, r, op1);
  } else if (MP (T_FOR, pos)) { /* iteration-statement */
    PT ('(');
    n = new_pos_node (c2m_ctx, N_FOR, pos);
    n->attr = curr_scope;
    curr_scope = n;
    if ((r = TRY (declaration)) != err_node) {
      op1 = r;
      curr_scope = n->attr;
    } else {
      curr_scope = n->attr;
      if (!M (';')) {
        P (expr);
        op1 = r;
        PT (';');
      } else {
        op1 = new_node (c2m_ctx, N_IGNORE);
      }
    }
    if (M (';')) {
      op2 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op2 = r;
      PT (';');
    }
    if (C (')')) {
      op3 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op3 = r;
    }
    PT (')');
    P (stmt);
    op_append (c2m_ctx, n, l);
    op_append (c2m_ctx, n, op1);
    op_append (c2m_ctx, n, op2);
    op_append (c2m_ctx, n, op3);
    op_append (c2m_ctx, n, r);
    r = n;
  } else if (MP (T_GOTO, pos)) { /* jump-statement */
    int indirect_p = FALSE;
    if (!M ('*')) {
      PTN (T_ID);
    } else {
      indirect_p = TRUE;
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, indirect_p ? N_INDIRECT_GOTO : N_GOTO, pos, l, r);
  } else if (MP (T_CONTINUE, pos)) { /* continue-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_CONTINUE, pos, l);
  } else if (MP (T_BREAK, pos)) { /* break-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_BREAK, pos, l);
  } else if (MP (T_RETURN, pos)) { /* return-statement */
    if (M (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      PT (';');
    }
    r = new_pos_node2 (c2m_ctx, N_RETURN, pos, l, r);
  } else { /* expression-statement */
    if (C (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, N_EXPR, POS (r), l, r);
  }
  return r;
}